

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

ssize_t __thiscall
xmrig::Threads<xmrig::CudaThreads>::read
          (Threads<xmrig::CudaThreads> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  MemberIterator that;
  Reference pVVar2;
  size_type sVar3;
  undefined4 in_register_00000034;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *member_1;
  MemberIterator __end1_1;
  MemberIterator __begin1_1;
  ConstObject *__range1_1;
  CudaThreads threads;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *member;
  MemberIterator __end1;
  MemberIterator __begin1;
  ConstObject *__range1;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  CudaThreads *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  Threads<xmrig::CudaThreads> *in_stack_ffffffffffffff78;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  in_stack_ffffffffffffff80;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_78;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_70;
  Reference local_50;
  Pointer local_48;
  ConstIterator local_40;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_20;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_18;
  undefined8 local_10;
  Threads<xmrig::CudaThreads> *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  local_18 = &local_20;
  local_28.ptr_ =
       (Pointer)rapidjson::
                GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                ::begin((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                         *)CONCAT17(in_stack_fffffffffffffeff,
                                    CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  local_40.ptr_ =
       (Pointer)rapidjson::
                GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                ::end((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)CONCAT17(in_stack_fffffffffffffeff,
                                  CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  while( true ) {
    local_48 = local_40.ptr_;
    bVar1 = rapidjson::
            GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator!=(&local_28,local_40);
    if (!bVar1) break;
    local_50 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator*(&local_28);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(&local_50->value);
    if ((bVar1) ||
       (bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsObject(&local_50->value), bVar1)) {
      CudaThreads::CudaThreads
                ((CudaThreads *)in_stack_ffffffffffffff80.ptr_,(Value *)in_stack_ffffffffffffff78);
      bVar1 = CudaThreads::isEmpty((CudaThreads *)0x1f478b);
      if (!bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(&local_50->name);
        move(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      CudaThreads::~CudaThreads((CudaThreads *)0x1f47fa);
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_28);
  }
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject(&local_20);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  local_70 = &local_78;
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::begin((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
           *)CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  that = rapidjson::
         GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
         ::end((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                *)CONCAT17(in_stack_fffffffffffffeff,
                           CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  while (bVar1 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator!=((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&stack0xffffffffffffff80,(ConstIterator)that.ptr_), bVar1) {
    pVVar2 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator*((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&stack0xffffffffffffff80);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(&pVVar2->value);
    if (!bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::IsObject(&pVVar2->value);
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&stack0xffffffffffffff80);
  }
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject(&local_78);
  sVar3 = std::
          map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
          ::size((map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
                  *)0x1f496e);
  return sVar3;
}

Assistant:

size_t xmrig::Threads<T>::read(const rapidjson::Value &value)
{
    using namespace rapidjson;

    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            T threads(member.value);

            if (!threads.isEmpty()) {
                move(member.name.GetString(), std::move(threads));
            }
        }
    }
    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            continue;
        }
    }

    return m_profiles.size();
}